

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::namemorecompile(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  Definition *pDVar2;
  ulong uVar3;
  
  requireDStackDepth(this,1,"NAME>COMPILE");
  requireDStackAvailable(this,1,"NAME>COMPILE");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  uVar3 = ((long)(this->definitions).
                 super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->definitions).
                 super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333;
  if (uVar3 < uVar1 || uVar3 - uVar1 == 0) {
    ForthStack<unsigned_int>::setTop(this_00,0);
    uVar1 = 0x15;
  }
  else {
    pDVar2 = getDefinition(this,uVar1);
    uVar1 = ((pDVar2->FlagImmediate & pDVar2->flags) == 0) + 0x14;
  }
  ForthStack<unsigned_int>::push(this_00,uVar1);
  return;
}

Assistant:

void namemorecompile(){
			REQUIRE_DSTACK_DEPTH(1, "NAME>COMPILE");
			REQUIRE_DSTACK_AVAILABLE(1, "NAME>COMPILE");
			auto nt=dStack.getTop();
			if(nt>=0 && nt<definitions.size()){
			auto defn=getDefinition(nt);
			auto immediate=defn->isImmediate();
			if(immediate){
				dStack.push(CELL(executeXt));
			} else {
				dStack.push(CELL(compileCommaXt));
			}
			} else {
				dStack.setTop(wrongCommandXt);
				dStack.push(compileCommaXt);
			}
		}